

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

void Hacl_Bignum256_32_mod_precomp
               (Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,uint32_t *a,uint32_t *res)

{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1;
  uint32_t *res_local;
  uint32_t *a_local;
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k_local;
  
  k1.n._0_4_ = (uint32_t)*(undefined8 *)&k->mu;
  bn_slow_precomp(k->n,(uint32_t)k1.n,k->r2,a,res);
  return;
}

Assistant:

void
Hacl_Bignum256_32_mod_precomp(
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 *k,
  uint32_t *a,
  uint32_t *res
)
{
  Hacl_Bignum_MontArithmetic_bn_mont_ctx_u32 k1 = *k;
  bn_slow_precomp(k1.n, k1.mu, k1.r2, a, res);
}